

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::PlotData::PlotData(PlotData *this,string *_plotspec)

{
  string *_plotspec_local;
  PlotData *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_plotspec);
  this->is_text = true;
  this->is_inline = false;
  this->has_data = false;
  std::__cxx11::string::string((string *)&this->data);
  std::__cxx11::string::string((string *)&this->filename);
  std::__cxx11::string::string((string *)&this->arr_or_rec);
  std::__cxx11::string::string((string *)&this->bin_fmt);
  std::__cxx11::string::string((string *)&this->bin_size);
  return;
}

Assistant:

explicit PlotData(const std::string &_plotspec) :
        plotspec(_plotspec),
        is_text(true),
        is_inline(false),
        has_data(false)
    { }